

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O3

string * __thiscall
libcalc::t2s_abi_cxx11_
          (string *__return_storage_ptr__,libcalc *this,
          vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *tokens)

{
  long *plVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  undefined8 uVar5;
  long *plVar6;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str.field_2._8_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)__str.field_2._8_8_;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar6 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  if (plVar6 != plVar1) {
    do {
      lVar2 = *(long *)*plVar6;
      local_58 = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,lVar2,((long *)*plVar6)[1] + lVar2);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != &__str._M_string_length) {
        operator_delete(local_58);
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar1);
    sVar3 = __return_storage_ptr__->_M_string_length;
    if (sVar3 != 0) {
      __return_storage_ptr__->_M_string_length = sVar3 - 1;
      (__return_storage_ptr__->_M_dataplus)._M_p[sVar3 - 1] = '\0';
      return __return_storage_ptr__;
    }
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     0xffffffffffffffff,0);
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (pcVar4 != (pointer)__str.field_2._8_8_) {
    operator_delete(pcVar4);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

std::string t2s(std::vector<Token *> tokens) {
  std::string out;

  for (Token *t : tokens) {
    out += t->value + " ";
  }

  out.erase(out.length() - 1);

  return out;
}